

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddCas.c
# Opt level: O2

int Extra_ProfileWidth(DdManager *dd,DdNode *Func,int *pProfile,int CutLevel)

{
  st__table *tNodeTopRef;
  int iVar1;
  int iVar2;
  st__generator *psVar3;
  ulong uVar4;
  undefined4 in_register_0000000c;
  long lVar5;
  uint uVar6;
  int *piVar7;
  DdNode *node;
  int LevelStart;
  uint *local_58;
  st__table *local_50;
  int local_44;
  st__table *local_40;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_0000000c,CutLevel);
  local_50 = st__init_table(st__ptrcmp,st__ptrhash);
  extraProfileUpdateTopLevel(local_50,0,Func);
  local_40 = Extra_CollectNodes(Func);
  psVar3 = st__init_gen(local_40);
  tNodeTopRef = local_50;
  while( true ) {
    iVar1 = st__gen(psVar3,(char **)&local_58,(char **)0x0);
    if (iVar1 == 0) break;
    piVar7 = (int *)((ulong)local_58 & 0xfffffffffffffffe);
    if (*piVar7 != 0x7fffffff) {
      extraProfileUpdateTopLevel(tNodeTopRef,dd->perm[*local_58] + 1,*(DdNode **)(piVar7 + 6));
      extraProfileUpdateTopLevel(tNodeTopRef,dd->perm[*local_58] + 1,*(DdNode **)(piVar7 + 4));
    }
  }
  st__free_gen(psVar3);
  st__free_table(local_40);
  iVar1 = dd->size;
  if (dd->size < dd->sizeZ) {
    iVar1 = dd->sizeZ;
  }
  for (lVar5 = 0; lVar5 <= iVar1; lVar5 = lVar5 + 1) {
    pProfile[lVar5] = 0;
  }
  psVar3 = st__init_gen(local_50);
  while( true ) {
    iVar2 = st__gen(psVar3,(char **)&local_58,(char **)&local_44);
    if (iVar2 == 0) break;
    piVar7 = &dd->size;
    if ((ulong)*(uint *)((ulong)local_58 & 0xfffffffffffffffe) != 0x7fffffff) {
      piVar7 = dd->perm + *(uint *)((ulong)local_58 & 0xfffffffffffffffe);
    }
    iVar2 = *piVar7;
    for (lVar5 = (long)local_44; lVar5 <= iVar2; lVar5 = lVar5 + 1) {
      pProfile[lVar5] = pProfile[lVar5] + 1;
    }
  }
  st__free_gen(psVar3);
  uVar6 = iVar1 + 1;
  if ((uint)local_38 - 1 < 0xfffffffe) {
    uVar6 = (uint)local_38;
  }
  uVar4 = 0;
  if ((int)uVar6 < 1) {
    uVar6 = 0;
  }
  iVar1 = 0;
  for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
    if (iVar1 <= pProfile[uVar4]) {
      iVar1 = pProfile[uVar4];
    }
  }
  st__free_table(local_50);
  return iVar1;
}

Assistant:

int Extra_ProfileWidth( DdManager * dd, DdNode * Func, int * pProfile, int CutLevel )
{
    st__generator * gen;
    st__table * tNodeTopRef; // this table stores the top level from which this node is pointed to
    st__table * tNodes;
    DdNode * node;
    DdNode * nodeR;
    int LevelStart, Limit;
    int i, size;
    int WidthMax;
  
    // start the mapping table
    tNodeTopRef = st__init_table( st__ptrcmp, st__ptrhash);;
    // add the topmost node to the profile
    extraProfileUpdateTopLevel( tNodeTopRef, 0, Func );

    // collect all nodes
    tNodes = Extra_CollectNodes( Func );
    // go though all the nodes and set the top level the cofactors are pointed from
//  Cudd_ForeachNode( dd, Func, genDD, node )
    st__foreach_item( tNodes, gen, (const char**)&node, NULL )
    {
//      assert( Cudd_Regular(node) );  // this procedure works only with ADD/ZDD (not BDD w/ compl.edges)
        nodeR = Cudd_Regular(node);
        if ( cuddIsConstant(nodeR) )
            continue;
        // this node is not a constant - consider its cofactors
        extraProfileUpdateTopLevel( tNodeTopRef, dd->perm[node->index]+1, cuddE(nodeR) );
        extraProfileUpdateTopLevel( tNodeTopRef, dd->perm[node->index]+1, cuddT(nodeR) );
    }
    st__free_table( tNodes );

    // clean the profile
    size = ddMax(dd->size, dd->sizeZ) + 1;
    for ( i = 0; i < size; i++ ) 
        pProfile[i] = 0;

    // create the profile
    st__foreach_item( tNodeTopRef, gen, (const char**)&node, (char**)&LevelStart )
    {
        nodeR = Cudd_Regular(node);
        Limit = (cuddIsConstant(nodeR))? dd->size: dd->perm[nodeR->index];
        for ( i = LevelStart; i <= Limit; i++ )
            pProfile[i]++;
    }

    if ( CutLevel != -1 && CutLevel != 0  )
        size = CutLevel;

    // get the max width
    WidthMax = 0;
    for ( i = 0; i < size; i++ ) 
        if ( WidthMax < pProfile[i] )
            WidthMax = pProfile[i];

    // deref the table
    st__free_table( tNodeTopRef );

    return WidthMax;
}